

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::UnicodeString::findAndReplace
          (UnicodeString *this,int32_t start,int32_t length,UnicodeString *oldText,int32_t oldStart,
          int32_t oldLength,UnicodeString *newText,int32_t newStart,int32_t newLength)

{
  int32_t start_00;
  int32_t local_38;
  int32_t local_34;
  int32_t local_30;
  int32_t local_2c;
  
  if ((((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x1) ==
        (undefined1  [56])0x0) &&
      ((undefined1  [56])((undefined1  [56])oldText->fUnion & (undefined1  [56])0x1) ==
       (undefined1  [56])0x0)) &&
     ((undefined1  [56])((undefined1  [56])newText->fUnion & (undefined1  [56])0x1) ==
      (undefined1  [56])0x0)) {
    local_38 = length;
    local_34 = start;
    local_30 = oldLength;
    local_2c = oldStart;
    pinIndices(this,&local_34,&local_38);
    pinIndices(oldText,&local_2c,&local_30);
    pinIndices(newText,&newStart,&newLength);
    if (local_30 != 0) {
      while (((0 < local_38 && (local_30 <= local_38)) &&
             (start_00 = indexOf(this,oldText,local_2c,local_30,local_34,local_38), -1 < start_00)))
      {
        doReplace(this,start_00,local_30,newText,newStart,newLength);
        local_38 = (local_34 - (start_00 + local_30)) + local_38;
        local_34 = newLength + start_00;
      }
    }
  }
  return this;
}

Assistant:

UnicodeString& 
UnicodeString::findAndReplace(int32_t start,
                  int32_t length,
                  const UnicodeString& oldText,
                  int32_t oldStart,
                  int32_t oldLength,
                  const UnicodeString& newText,
                  int32_t newStart,
                  int32_t newLength)
{
  if(isBogus() || oldText.isBogus() || newText.isBogus()) {
    return *this;
  }

  pinIndices(start, length);
  oldText.pinIndices(oldStart, oldLength);
  newText.pinIndices(newStart, newLength);

  if(oldLength == 0) {
    return *this;
  }

  while(length > 0 && length >= oldLength) {
    int32_t pos = indexOf(oldText, oldStart, oldLength, start, length);
    if(pos < 0) {
      // no more oldText's here: done
      break;
    } else {
      // we found oldText, replace it by newText and go beyond it
      replace(pos, oldLength, newText, newStart, newLength);
      length -= pos + oldLength - start;
      start = pos + newLength;
    }
  }

  return *this;
}